

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O1

void __thiscall
mp::BucketAccum1Type<mp::LinTerms>::~BucketAccum1Type(BucketAccum1Type<mp::LinTerms> *this)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0x1d88;
  do {
    uVar1 = *(ulong *)((long)(this->buckets_)._M_elems[0].vars_.
                             super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.
                             m_data + lVar2 + 0xfffffffffffffff0U);
    if (6 < uVar1) {
      operator_delete(*(void **)((long)(&(this->buckets_)._M_elems[0].vars_.
                                         super_small_vector_base<std::allocator<int>,_6U>.m_data.
                                         m_storage + 0xffffffffffffffff) + lVar2),uVar1 << 2);
    }
    uVar1 = *(ulong *)((long)(this->buckets_)._M_elems[0].coefs_.
                             super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                             m_data + lVar2 + 0xfffffffffffffff0U);
    if (6 < uVar1) {
      operator_delete(*(void **)((long)(this->buckets_)._M_elems[0].coefs_.
                                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                       m_storage.m_data + lVar2 + -0x18),uVar1 << 3);
    }
    lVar2 = lVar2 + -0x78;
  } while (lVar2 != -0x78);
  return;
}

Assistant:

BucketAccum1Type<Body>::~BucketAccum1Type() {
#ifndef NDEBUG
  for (const auto& b: buckets_)
    assert(b.empty());
#endif
}